

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsItem::setCacheMode(QGraphicsItem *this,CacheMode mode,QSize *logicalCacheSize)

{
  QGraphicsItemPrivate *pQVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined4 extraout_EAX;
  QGraphicsItemCache *this_00;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  uVar2 = *(ulong *)&pQVar1->field_0x160;
  uVar3 = uVar2 >> 0x15;
  uVar5 = (uint)uVar3 & 3;
  *(ulong *)&pQVar1->field_0x160 =
       uVar2 & 0xffffffffff9fffff |
       (ulong)((mode & (DeviceCoordinateCache|ItemCoordinateCache)) << 0x15);
  bVar6 = true;
  if (((mode != NoCache || (uVar3 & 3) != 0) && ((mode != NoCache || (uVar5 != 2)))) &&
     ((mode != DeviceCoordinateCache || ((uVar3 & 3) != 0)))) {
    bVar6 = uVar5 == 2 && mode == DeviceCoordinateCache;
  }
  pQVar1 = (this->d_ptr).d;
  if (mode == NoCache) {
    QGraphicsItemPrivate::removeExtraItemCache(pQVar1);
  }
  else {
    this_00 = QGraphicsItemPrivate::extraItemCache(pQVar1);
    QGraphicsItemCache::purge(this_00);
    if (mode == ItemCoordinateCache) {
      bVar4 = bVar6;
      if (uVar5 == 1) {
        iVar8 = -(uint)((*logicalCacheSize).wd.m_i == (this_00->fixedSize).wd.m_i);
        iVar9 = -(uint)((*logicalCacheSize).ht.m_i == (this_00->fixedSize).ht.m_i);
        auVar7._4_4_ = iVar8;
        auVar7._0_4_ = iVar8;
        auVar7._8_4_ = iVar9;
        auVar7._12_4_ = iVar9;
        iVar8 = movmskpd(extraout_EAX,auVar7);
        bVar4 = true;
        if (iVar8 != 3) {
          bVar4 = bVar6;
        }
      }
      bVar6 = bVar4;
      this_00->fixedSize = *logicalCacheSize;
    }
  }
  if (!bVar6) {
    local_58.w = 0.0;
    local_58.h = 0.0;
    local_58.xp = 0.0;
    local_58.yp = 0.0;
    update(this,&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setCacheMode(CacheMode mode, const QSize &logicalCacheSize)
{
    CacheMode lastMode = CacheMode(d_ptr->cacheMode);
    d_ptr->cacheMode = mode;
    bool noVisualChange = (mode == NoCache && lastMode == NoCache)
                          || (mode == NoCache && lastMode == DeviceCoordinateCache)
                          || (mode == DeviceCoordinateCache && lastMode == NoCache)
                          || (mode == DeviceCoordinateCache && lastMode == DeviceCoordinateCache);
    if (mode == NoCache) {
        d_ptr->removeExtraItemCache();
    } else {
        QGraphicsItemCache *cache = d_ptr->extraItemCache();

        // Reset old cache
        cache->purge();

        if (mode == ItemCoordinateCache) {
            if (lastMode == mode && cache->fixedSize == logicalCacheSize)
                noVisualChange = true;
            cache->fixedSize = logicalCacheSize;
        }
    }
    if (!noVisualChange)
        update();
}